

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O2

void amrex::Assert_host(char *EX,char *file,int line,char *msg)

{
  runtime_error *this;
  char *__format;
  char buf [512];
  
  if (msg == (char *)0x0) {
    __format = "Assertion `%s\' failed, file \"%s\", line %d";
  }
  else {
    __format = "Assertion `%s\' failed, file \"%s\", line %d, Msg: %s";
  }
  snprintf(buf,0x200,__format,EX,file,(ulong)(uint)line);
  if (system::error_handler == (code *)0x0) {
    if (system::throw_exception != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,buf);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    write_to_stderr_without_buffering(buf);
    ParallelDescriptor::Abort(6,true);
  }
  else {
    (*system::error_handler)(buf);
  }
  return;
}

Assistant:

void
amrex::Assert_host (const char* EX, const char* file, int line, const char* msg)
{
    const int N = 512;

    char buf[N];

    if (msg) {
        snprintf(buf,
                 N,
                 "Assertion `%s' failed, file \"%s\", line %d, Msg: %s",
                 EX,
                 file,
                 line,
                 msg);
    } else {
        snprintf(buf,
                 N,
                 "Assertion `%s' failed, file \"%s\", line %d",
                 EX,
                 file,
                 line);
    }

    if (system::error_handler) {
        system::error_handler(buf);
    } else if (system::throw_exception) {
        throw RuntimeError(buf);
    } else {
       write_to_stderr_without_buffering(buf);
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_abort_omp_critical)
#endif
       ParallelDescriptor::Abort();
   }
}